

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

void * mdns_string_make(void *data,size_t capacity,char *name,size_t length)

{
  char *__s;
  void *pvVar1;
  undefined1 *puVar2;
  ulong __n;
  ulong uVar3;
  long lVar4;
  ulong local_48;
  
  local_48 = capacity;
  if (length != 0) {
    uVar3 = 0;
    do {
      __s = name + uVar3;
      __n = length - uVar3;
      pvVar1 = memchr(__s,0x2e,__n);
      if ((pvVar1 == (void *)0x0) || (lVar4 = (long)pvVar1 - (long)name, lVar4 == -1)) {
        if (capacity <= __n) goto LAB_0024298f;
        *(char *)data = (char)__n;
        memcpy((undefined1 *)((long)data + 1),__s,__n);
        data = (void *)((long)data + __n + 1);
        local_48 = local_48 - (__n + 1);
        break;
      }
      uVar3 = lVar4 - uVar3;
      if (local_48 <= uVar3) goto LAB_0024298f;
      *(char *)data = (char)uVar3;
      memcpy((undefined1 *)((long)data + 1),__s,uVar3);
      data = (void *)((long)data + uVar3 + 1);
      local_48 = local_48 - (uVar3 + 1);
      uVar3 = lVar4 + 1;
    } while (uVar3 < length);
  }
  if (local_48 == 0) {
LAB_0024298f:
    puVar2 = (undefined1 *)0x0;
  }
  else {
    *(undefined1 *)data = 0;
    puVar2 = (undefined1 *)((long)data + 1);
  }
  return puVar2;
}

Assistant:

void*
mdns_string_make(void* data, size_t capacity, const char* name, size_t length) {
	size_t pos = 0;
	size_t last_pos = 0;
	size_t remain = capacity;
	unsigned char* dest = (unsigned char*)data;
	while ((last_pos < length) && ((pos = mdns_string_find(name, length, '.', last_pos)) != MDNS_INVALID_POS)) {
		size_t sublength = pos - last_pos;
		if (sublength < remain) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
		last_pos = pos + 1;
	}
	if (last_pos < length) {
		size_t sublength = length - last_pos;
		if (sublength < capacity) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
	}
	if (!remain)
		return 0;
	*dest++ = 0;
	return dest;
}